

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O0

int __thiscall CppJieba::MixSegment::init(MixSegment *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  undefined7 extraout_var;
  char *pcVar3;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 uVar4;
  char *local_d8;
  char *local_c0;
  char *local_a8;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  MixSegment *local_10;
  bool local_1;
  
  local_10 = this;
  bVar1 = SegmentBase::_getInitFlag(&this->super_SegmentBase);
  if (bVar1) {
    pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                     ,0x2f);
    if (pcVar3 == (char *)0x0) {
      local_a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
      ;
    }
    else {
      local_a8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                         ,0x2f);
      local_a8 = local_a8 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"inited.",&local_31);
    Limonp::Logger::LoggingF(3,local_a8,0x1d,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    local_1 = false;
    uVar4 = extraout_var;
  }
  else {
    uVar2 = MPSegment::init(&this->_mpSeg,ctx);
    if ((uVar2 & 1) == 0) {
      pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                       ,0x2f);
      if (pcVar3 == (char *)0x0) {
        local_c0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
        ;
      }
      else {
        local_c0 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                           ,0x2f);
        local_c0 = local_c0 + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"_mpSeg init",&local_69);
      Limonp::Logger::LoggingF(3,local_c0,0x22,(string *)local_68);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      local_1 = false;
      uVar4 = extraout_var_00;
    }
    else {
      uVar2 = HMMSegment::init(&this->_hmmSeg,ctx);
      if ((uVar2 & 1) == 0) {
        pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                         ,0x2f);
        if (pcVar3 == (char *)0x0) {
          local_d8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
          ;
        }
        else {
          local_d8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                             ,0x2f);
          local_d8 = local_d8 + 1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_90,"_hmmSeg init",&local_91);
        Limonp::Logger::LoggingF(3,local_d8,0x27,(string *)local_90);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
        local_1 = false;
        uVar4 = extraout_var_01;
      }
      else {
        local_1 = SegmentBase::_setInitFlag(&this->super_SegmentBase,true);
        uVar4 = extraout_var_02;
      }
    }
  }
  return (int)CONCAT71(uVar4,local_1);
}

Assistant:

virtual bool init()
            {
                if(_getInitFlag())
                {
                    LogError("inited.");
                    return false;
                }
                if(!_mpSeg.init())
                {
                    LogError("_mpSeg init");
                    return false;
                }
                if(!_hmmSeg.init())
                {
                    LogError("_hmmSeg init");
                    return false;
                }
                return _setInitFlag(true);
            }